

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O0

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Case(ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
       *this)

{
  size_type sVar1;
  byte bVar2;
  bool bVar3;
  eval_error *peVar4;
  element_type *peVar5;
  allocator<char> local_161;
  string local_160;
  undefined1 local_13d;
  File_Position local_13c;
  allocator<char> local_131;
  string local_130;
  Static_String local_110;
  allocator<char> local_f9;
  string local_f8;
  undefined1 local_d5;
  File_Position local_d4;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a5;
  File_Position local_a4;
  allocator<char> local_99;
  string local_98;
  undefined1 local_75;
  File_Position local_74;
  allocator<char> local_69;
  string local_68;
  Static_String local_38;
  size_type local_28;
  size_type prev_stack_top;
  bool retval;
  Depth_Counter dc;
  ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
  *this_local;
  
  dc.parser = this;
  Depth_Counter::Depth_Counter((Depth_Counter *)&stack0xffffffffffffffe8,this);
  prev_stack_top._7_1_ = 0;
  local_28 = Catch::clara::std::
             vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
             ::size(&this->m_match_stack);
  utility::Static_String::Static_String<5ul>(&local_38,(char (*) [5])0xb71bae);
  bVar3 = Keyword(this,&local_38);
  if (bVar3) {
    prev_stack_top._7_1_ = 1;
    bVar3 = Char(this,'(');
    if (!bVar3) {
      local_75 = 1;
      peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"Incomplete \'case\' expression",&local_69);
      File_Position::File_Position(&local_74,(this->m_position).line,(this->m_position).col);
      peVar5 = Catch::clara::std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      exception::eval_error::eval_error(peVar4,&local_68,&local_74,peVar5);
      local_75 = 0;
      __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    bVar3 = Operator(this,0);
    if ((!bVar3) || (bVar3 = Char(this,')'), !bVar3)) {
      local_a5 = 1;
      peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"Incomplete \'case\' expression",&local_99);
      File_Position::File_Position(&local_a4,(this->m_position).line,(this->m_position).col);
      peVar5 = Catch::clara::std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      exception::eval_error::eval_error(peVar4,&local_98,&local_a4,peVar5);
      local_a5 = 0;
      __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    do {
      bVar3 = Eol(this);
    } while (bVar3);
    bVar3 = Block(this);
    sVar1 = local_28;
    if (!bVar3) {
      local_d5 = 1;
      peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"Incomplete \'case\' block",&local_c9);
      File_Position::File_Position(&local_d4,(this->m_position).line,(this->m_position).col);
      peVar5 = Catch::clara::std::
               __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&this->m_filename);
      exception::eval_error::eval_error(peVar4,&local_c8,&local_d4,peVar5);
      local_d5 = 0;
      __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
    ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
    ::build_match<chaiscript::eval::Case_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
              ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                *)this,sVar1,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  else {
    utility::Static_String::Static_String<8ul>(&local_110,(char (*) [8])"default");
    bVar3 = Keyword(this,&local_110);
    if (bVar3) {
      prev_stack_top._7_1_ = 1;
      do {
        bVar3 = Eol(this);
      } while (bVar3);
      bVar3 = Block(this);
      sVar1 = local_28;
      if (!bVar3) {
        local_13d = 1;
        peVar4 = (eval_error *)__cxa_allocate_exception(0x90);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_130,"Incomplete \'default\' block",&local_131);
        File_Position::File_Position(&local_13c,(this->m_position).line,(this->m_position).col);
        peVar5 = Catch::clara::std::
                 __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->m_filename);
        exception::eval_error::eval_error(peVar4,&local_130,&local_13c,peVar5);
        local_13d = 0;
        __cxa_throw(peVar4,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"",&local_161);
      ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
      ::build_match<chaiscript::eval::Default_AST_Node<chaiscript::eval::Tracer<Count_Tracer>>>
                ((ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,chaiscript::optimizer::Unused_Return,chaiscript::optimizer::Constant_Fold,chaiscript::optimizer::If,chaiscript::optimizer::Return,chaiscript::optimizer::Dead_Code,chaiscript::optimizer::Block,chaiscript::optimizer::For_Loop,chaiscript::optimizer::Assign_Decl>,512ul>
                  *)this,sVar1,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
    }
  }
  bVar2 = prev_stack_top._7_1_;
  Depth_Counter::~Depth_Counter((Depth_Counter *)&stack0xffffffffffffffe8);
  return (bool)(bVar2 & 1);
}

Assistant:

bool Case() {
        Depth_Counter dc{this};
        bool retval = false;

        const auto prev_stack_top = m_match_stack.size();

        if (Keyword("case")) {
          retval = true;

          if (!Char('(')) {
            throw exception::eval_error("Incomplete 'case' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          if (!(Operator() && Char(')'))) {
            throw exception::eval_error("Incomplete 'case' expression", File_Position(m_position.line, m_position.col), *m_filename);
          }

          while (Eol()) {
          }

          if (!Block()) {
            throw exception::eval_error("Incomplete 'case' block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Case_AST_Node<Tracer>>(prev_stack_top);
        } else if (Keyword("default")) {
          retval = true;

          while (Eol()) {
          }

          if (!Block()) {
            throw exception::eval_error("Incomplete 'default' block", File_Position(m_position.line, m_position.col), *m_filename);
          }

          build_match<eval::Default_AST_Node<Tracer>>(prev_stack_top);
        }

        return retval;
      }